

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  pointer pSVar2;
  size_t sVar3;
  ostream *poVar4;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar2 -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar2 = pSVar2 + 1, pSVar2 != pSVar1) {
      printHeaderString(this,&pSVar2->name,2);
    }
    Colour::use(None);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_28.file = pSVar2[-1].lineInfo.file;
  local_28.line = pSVar2[-1].lineInfo.line;
  if (*local_28.file != '\0') {
    poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    if (getLineOfChars<(char)45>()::line == '\0') {
      uRam00000000001a1d70 = 0x2d2d2d2d2d2d2d;
      uRam00000000001a1d77._0_1_ = '-';
      uRam00000000001a1d77._1_1_ = '-';
      uRam00000000001a1d77._2_1_ = '-';
      uRam00000000001a1d77._3_1_ = '-';
      uRam00000000001a1d77._4_1_ = '-';
      uRam00000000001a1d77._5_1_ = '-';
      uRam00000000001a1d77._6_1_ = '-';
      uRam00000000001a1d77._7_1_ = '-';
      DAT_001a1d60 = '-';
      DAT_001a1d60_1._0_1_ = '-';
      DAT_001a1d60_1._1_1_ = '-';
      DAT_001a1d60_1._2_1_ = '-';
      DAT_001a1d60_1._3_1_ = '-';
      DAT_001a1d60_1._4_1_ = '-';
      DAT_001a1d60_1._5_1_ = '-';
      DAT_001a1d60_1._6_1_ = '-';
      uRam00000000001a1d68 = 0x2d2d2d2d2d2d2d;
      DAT_001a1d6f = 0x2d;
      DAT_001a1d50 = '-';
      DAT_001a1d50_1._0_1_ = '-';
      DAT_001a1d50_1._1_1_ = '-';
      DAT_001a1d50_1._2_1_ = '-';
      DAT_001a1d50_1._3_1_ = '-';
      DAT_001a1d50_1._4_1_ = '-';
      DAT_001a1d50_1._5_1_ = '-';
      DAT_001a1d50_1._6_1_ = '-';
      uRam00000000001a1d58._0_1_ = '-';
      uRam00000000001a1d58._1_1_ = '-';
      uRam00000000001a1d58._2_1_ = '-';
      uRam00000000001a1d58._3_1_ = '-';
      uRam00000000001a1d58._4_1_ = '-';
      uRam00000000001a1d58._5_1_ = '-';
      uRam00000000001a1d58._6_1_ = '-';
      uRam00000000001a1d58._7_1_ = '-';
      DAT_001a1d40 = '-';
      DAT_001a1d40_1._0_1_ = '-';
      DAT_001a1d40_1._1_1_ = '-';
      DAT_001a1d40_1._2_1_ = '-';
      DAT_001a1d40_1._3_1_ = '-';
      DAT_001a1d40_1._4_1_ = '-';
      DAT_001a1d40_1._5_1_ = '-';
      DAT_001a1d40_1._6_1_ = '-';
      uRam00000000001a1d48._0_1_ = '-';
      uRam00000000001a1d48._1_1_ = '-';
      uRam00000000001a1d48._2_1_ = '-';
      uRam00000000001a1d48._3_1_ = '-';
      uRam00000000001a1d48._4_1_ = '-';
      uRam00000000001a1d48._5_1_ = '-';
      uRam00000000001a1d48._6_1_ = '-';
      uRam00000000001a1d48._7_1_ = '-';
      getLineOfChars<(char)45>()::line = '-';
      getLineOfChars<(char)45>()::line_1._0_1_ = '-';
      getLineOfChars<(char)45>()::line_1._1_1_ = '-';
      getLineOfChars<(char)45>()::line_1._2_1_ = '-';
      getLineOfChars<(char)45>()::line_1._3_1_ = '-';
      getLineOfChars<(char)45>()::line_1._4_1_ = '-';
      getLineOfChars<(char)45>()::line_1._5_1_ = '-';
      getLineOfChars<(char)45>()::line_1._6_1_ = '-';
      uRam00000000001a1d38._0_1_ = '-';
      uRam00000000001a1d38._1_1_ = '-';
      uRam00000000001a1d38._2_1_ = '-';
      uRam00000000001a1d38._3_1_ = '-';
      uRam00000000001a1d38._4_1_ = '-';
      uRam00000000001a1d38._5_1_ = '-';
      uRam00000000001a1d38._6_1_ = '-';
      uRam00000000001a1d38._7_1_ = '-';
      DAT_001a1d7f = 0;
    }
    sVar3 = strlen(&getLineOfChars<(char)45>()::line);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,&getLineOfChars<(char)45>()::line,sVar3);
    local_2a[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
    local_2a[1] = 0;
    Colour::use(FileName);
    os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    operator<<(os,&local_28);
    local_2a[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
    Colour::use(None);
  }
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a1e10 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a1e17._0_1_ = '.';
    uRam00000000001a1e17._1_1_ = '.';
    uRam00000000001a1e17._2_1_ = '.';
    uRam00000000001a1e17._3_1_ = '.';
    uRam00000000001a1e17._4_1_ = '.';
    uRam00000000001a1e17._5_1_ = '.';
    uRam00000000001a1e17._6_1_ = '.';
    uRam00000000001a1e17._7_1_ = '.';
    DAT_001a1e00 = '.';
    DAT_001a1e00_1._0_1_ = '.';
    DAT_001a1e00_1._1_1_ = '.';
    DAT_001a1e00_1._2_1_ = '.';
    DAT_001a1e00_1._3_1_ = '.';
    DAT_001a1e00_1._4_1_ = '.';
    DAT_001a1e00_1._5_1_ = '.';
    DAT_001a1e00_1._6_1_ = '.';
    uRam00000000001a1e08 = 0x2e2e2e2e2e2e2e;
    DAT_001a1e0f = 0x2e;
    DAT_001a1df0 = '.';
    DAT_001a1df0_1._0_1_ = '.';
    DAT_001a1df0_1._1_1_ = '.';
    DAT_001a1df0_1._2_1_ = '.';
    DAT_001a1df0_1._3_1_ = '.';
    DAT_001a1df0_1._4_1_ = '.';
    DAT_001a1df0_1._5_1_ = '.';
    DAT_001a1df0_1._6_1_ = '.';
    uRam00000000001a1df8._0_1_ = '.';
    uRam00000000001a1df8._1_1_ = '.';
    uRam00000000001a1df8._2_1_ = '.';
    uRam00000000001a1df8._3_1_ = '.';
    uRam00000000001a1df8._4_1_ = '.';
    uRam00000000001a1df8._5_1_ = '.';
    uRam00000000001a1df8._6_1_ = '.';
    uRam00000000001a1df8._7_1_ = '.';
    DAT_001a1de0 = '.';
    DAT_001a1de0_1._0_1_ = '.';
    DAT_001a1de0_1._1_1_ = '.';
    DAT_001a1de0_1._2_1_ = '.';
    DAT_001a1de0_1._3_1_ = '.';
    DAT_001a1de0_1._4_1_ = '.';
    DAT_001a1de0_1._5_1_ = '.';
    DAT_001a1de0_1._6_1_ = '.';
    uRam00000000001a1de8._0_1_ = '.';
    uRam00000000001a1de8._1_1_ = '.';
    uRam00000000001a1de8._2_1_ = '.';
    uRam00000000001a1de8._3_1_ = '.';
    uRam00000000001a1de8._4_1_ = '.';
    uRam00000000001a1de8._5_1_ = '.';
    uRam00000000001a1de8._6_1_ = '.';
    uRam00000000001a1de8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a1dd8._0_1_ = '.';
    uRam00000000001a1dd8._1_1_ = '.';
    uRam00000000001a1dd8._2_1_ = '.';
    uRam00000000001a1dd8._3_1_ = '.';
    uRam00000000001a1dd8._4_1_ = '.';
    uRam00000000001a1dd8._5_1_ = '.';
    uRam00000000001a1dd8._6_1_ = '.';
    uRam00000000001a1dd8._7_1_ = '.';
    DAT_001a1e1f = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)46>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    if (!lineInfo.empty()) {
        stream << getLineOfChars<'-'>() << '\n';
        Colour colourGuard(Colour::FileName);
        stream << lineInfo << '\n';
    }
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}